

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_method_common.c
# Opt level: O1

size_t nhr_request_map_strings_length(_nhr_map_node *map,size_t iteration_increment)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (map == (_nhr_map_node *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    do {
      sVar1 = strlen(map->key);
      sVar2 = strlen((map->value).string);
      sVar3 = sVar3 + iteration_increment + sVar1 + sVar2;
      map = map->next;
    } while (map != (_nhr_map_node_struct *)0x0);
  }
  return sVar3;
}

Assistant:

size_t nhr_request_map_strings_length(_nhr_map_node * map, const size_t iteration_increment) {
	size_t len = 0;
	_nhr_map_node *cur = map;
	while (cur) {
		len += strlen(cur->key) + strlen(cur->value.string) + iteration_increment;
		cur = cur->next;
	}
	return len;
}